

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_config.c
# Opt level: O1

void dump_output(int length_estimate,char *format,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar2;
  char *__s;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  lVar2 = (long)IP_config_output_len;
  if (lVar2 != -1) {
    local_b8 = in_RDX;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    IP_config_diagnostics = (char *)realloc(IP_config_diagnostics,lVar2 + 0x400);
    __s = IP_config_diagnostics + lVar2;
    local_e8 = 0x3000000010;
    local_e0 = &ap[0].overflow_arg_area;
    local_d8 = local_c8;
    vsprintf(__s,format,&local_e8);
    sVar1 = strlen(__s);
    IP_config_output_len = IP_config_output_len + (int)sVar1;
  }
  return;
}

Assistant:

static void
dump_output(int length_estimate, char *format, ...)
{
    char buf[1024];
    char *tmp = &buf[0];
    va_list ap;
    int free_tmp = 0;

    if (IP_config_output_len == -1) return;

    IP_config_diagnostics = realloc(IP_config_diagnostics, IP_config_output_len + length_estimate + 1);
    tmp = IP_config_diagnostics + IP_config_output_len;

    if (length_estimate > 1024) {
	tmp = malloc(length_estimate + 1);
	free_tmp++;
    }
#ifdef STDC_HEADERS
    va_start(ap, format);
#else
    va_start(ap);
#endif
    vsprintf(tmp, format, ap);
    va_end(ap);
    IP_config_output_len += (int)strlen(tmp);
    if (free_tmp) free(tmp);
}